

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::columnsAboutToBeRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int first,int last)

{
  bool bVar1;
  int iVar2;
  QDebug *pQVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_108 [24];
  undefined1 local_f0 [24];
  QArrayDataPointer<char16_t> local_d8;
  ChangeInFlight local_c0 [6];
  char *local_a8;
  QDebug local_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [16];
  QVariant local_70;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0[0] = None;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,local_c0,"changeInFlight","ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x313);
  if (bVar1) {
    this->changeInFlight = ColumnsRemoved;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_c0[0] = ColumnsMoved;
      local_c0[1] = None;
      local_c0[2] = None;
      local_c0[3] = None;
      local_c0[4] = None;
      local_c0[5] = 0;
      local_a8 = lcModelTest::category.name;
      QMessageLogger::debug();
      pQVar3 = QDebug::operator<<(&local_a0,"columnsAboutToBeRemoved");
      pQVar3 = QDebug::operator<<(pQVar3,"start=");
      pQVar3 = QDebug::operator<<(pQVar3,first);
      pQVar3 = QDebug::operator<<(pQVar3,"end=");
      pQVar3 = QDebug::operator<<(pQVar3,last);
      pQVar3 = QDebug::operator<<(pQVar3,"parent=");
      local_98._0_8_ = pQVar3->stream;
      *(int *)(local_98._0_8_ + 0x28) = *(int *)(local_98._0_8_ + 0x28) + 1;
      operator<<((Stream *)(local_98 + 8),(QModelIndex *)local_98);
      pQVar3 = QDebug::operator<<((QDebug *)(local_98 + 8),"parent data=");
      pQVar4 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x90))(&local_50,pQVar4,parent,0);
      QVariant::toString();
      pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_d8);
      pQVar3 = QDebug::operator<<(pQVar3,"current count of parent=");
      pQVar4 = (this->model).wp.value;
      iVar2 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,parent);
      pQVar3 = QDebug::operator<<(pQVar3,iVar2);
      pQVar3 = QDebug::operator<<(pQVar3,"last before removal=");
      local_98._16_8_ = pQVar3->stream;
      *(int *)(local_98._16_8_ + 0x28) = *(int *)(local_98._16_8_ + 0x28) + 1;
      pQVar4 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_f0,pQVar4,first + -1,0,parent);
      operator<<((Stream *)local_80,(QModelIndex *)(local_98 + 0x10));
      iVar2 = (((this->model).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i;
      pQVar4 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_108,pQVar4,first + -1,0,parent);
      if (iVar2 == 0) {
        pQVar4 = (QObject *)0x0;
      }
      (**(code **)(*(long *)pQVar4 + 0x90))(&local_70,pQVar4,local_108,0);
      operator<<((QDebug *)(local_80 + 8),(QVariant *)local_80);
      QDebug::~QDebug((QDebug *)(local_80 + 8));
      QVariant::~QVariant(&local_70);
      QDebug::~QDebug((QDebug *)local_80);
      QDebug::~QDebug((QDebug *)(local_98 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QVariant::~QVariant(&local_50);
      QDebug::~QDebug((QDebug *)(local_98 + 8));
      QDebug::~QDebug((QDebug *)local_98);
      QDebug::~QDebug(&local_a0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::columnsAboutToBeRemoved(const QModelIndex &parent, int first,
                                                              int last)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::ColumnsRemoved;

    qCDebug(lcModelTest) << "columnsAboutToBeRemoved"
                         << "start=" << first << "end=" << last << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before removal=" << model->index(first - 1, 0, parent)
                         << model->data(model->index(first - 1, 0, parent));
}